

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O3

void set_bang(t_set *x)

{
  t_gpointer *gp;
  char cVar1;
  char *pcVar2;
  anon_union_8_2_d3a68b8d_for_gs_un *paVar3;
  int iVar4;
  t_symbol *s;
  t_symbol *ptVar5;
  t_template *x_00;
  int iVar6;
  _inlet *x_01;
  long lVar7;
  t_gstub *ptVar8;
  t_setvariable *ptVar9;
  bool bVar10;
  t_word *wp;
  
  iVar6 = x->x_nin;
  gp = &x->x_gp;
  ptVar8 = (x->x_gp).gp_stub;
  iVar4 = gpointer_check(gp,0);
  if (iVar4 == 0) {
    pd_error(x,"set: empty pointer");
    return;
  }
  ptVar5 = x->x_templatesym;
  cVar1 = *ptVar5->s_name;
  s = gpointer_gettemplatesym(gp);
  if ((cVar1 != '\0') && (bVar10 = ptVar5 != s, s = ptVar5, bVar10)) {
    pcVar2 = ptVar5->s_name;
    ptVar5 = gpointer_gettemplatesym(gp);
    pd_error(x,"set %s: got wrong template (%s)",pcVar2,ptVar5->s_name);
    return;
  }
  x_00 = template_findbyname(s);
  if (x_00 == (t_template *)0x0) {
    pd_error(x,"set: couldn\'t find template %s",s->s_name);
    return;
  }
  if (iVar6 == 0) {
    return;
  }
  lVar7 = 0x18;
  if (ptVar8->gs_which == 2) {
    lVar7 = 0;
  }
  wp = (t_word *)((long)((x->x_gp).gp_un.gp_scalar)->sc_vec + lVar7 + -0x18);
  if (x->x_issymbol == 0) {
    if (0 < iVar6) {
      ptVar9 = x->x_variables;
      do {
        template_setfloat(x_00,ptVar9->gv_sym,wp,(ptVar9->gv_w).w_float,1);
        ptVar9 = ptVar9 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  else if (0 < iVar6) {
    ptVar9 = x->x_variables;
    do {
      template_setsymbol(x_00,ptVar9->gv_sym,wp,(ptVar9->gv_w).w_symbol,1);
      ptVar9 = ptVar9 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  if (ptVar8->gs_which == 1) {
    x_01 = (_inlet *)(gp->gp_un).gp_scalar;
  }
  else {
    do {
      paVar3 = &ptVar8->gs_un;
      ptVar8 = (t_gstub *)paVar3->gs_glist->gl_list;
    } while (ptVar8->gs_which == 2);
    x_01 = (paVar3->gs_glist->gl_obj).te_inlet;
  }
  scalar_redraw((t_scalar *)x_01,(ptVar8->gs_un).gs_glist);
  return;
}

Assistant:

static void set_bang(t_set *x)
{
    int nitems = x->x_nin, i;
    t_symbol *templatesym;
    t_template *template;
    t_setvariable *vp;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "set: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) != gpointer_gettemplatesym(gp))
        {
            pd_error(x, "set %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "set: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!nitems)
        return;
    if (gs->gs_which == GP_ARRAY)
        vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    if (x->x_issymbol)
        for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
            template_setsymbol(template, vp->gv_sym, vec, vp->gv_w.w_symbol, 1);
    else for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
        template_setfloat(template, vp->gv_sym, vec, vp->gv_w.w_float, 1);
    if (gs->gs_which == GP_GLIST)
        scalar_redraw(gp->gp_un.gp_scalar, gs->gs_un.gs_glist);
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        scalar_redraw(owner_array->a_gp.gp_un.gp_scalar,
            owner_array->a_gp.gp_stub->gs_un.gs_glist);
    }
}